

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O0

void __thiscall
Assimp::LWO::AnimResolver::GetKeys
          (AnimResolver *this,vector<aiVectorKey,_std::allocator<aiVectorKey>_> *out,
          Envelope *_envl_x,Envelope *_envl_y,Envelope *_envl_z,uint _flags)

{
  double dVar1;
  bool bVar2;
  pointer __a;
  pointer __a_00;
  pointer __b;
  double *pdVar3;
  ulong uVar4;
  unsigned_long *__b_00;
  reference pKVar5;
  reference paVar6;
  reference local_2c8;
  reference local_2b8;
  reference local_2a8;
  __normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>
  local_1e8;
  __normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>
  local_1e0;
  iterator it;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_1d0;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_1c8;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_1c0;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_1b8;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_1b0;
  double local_1a8;
  double lasttime;
  aiVectorKey fill;
  Key *local_180;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_178;
  Key *local_170;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_168;
  Key *local_160;
  size_type local_158;
  size_type local_150;
  size_type local_148;
  undefined1 local_140 [16];
  pointer local_128;
  double sr;
  size_t reserve;
  undefined1 local_108 [8];
  Key key_dummy;
  Envelope def_z;
  Envelope def_y;
  Envelope def_x;
  uint _flags_local;
  Envelope *_envl_z_local;
  Envelope *_envl_y_local;
  Envelope *_envl_x_local;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> *out_local;
  AnimResolver *this_local;
  
  this->envl_x = _envl_x;
  this->envl_y = _envl_y;
  this->envl_z = _envl_z;
  this->flags = _flags;
  Envelope::Envelope((Envelope *)&def_y.old_last);
  Envelope::Envelope((Envelope *)&def_z.old_last);
  Envelope::Envelope((Envelope *)(key_dummy.params + 4));
  Key::Key((Key *)local_108);
  local_108 = (undefined1  [8])0x0;
  if ((((this->envl_x == (Envelope *)0x0) || (this->envl_x->type != EnvelopeType_Scaling_X)) &&
      ((this->envl_y == (Envelope *)0x0 || (this->envl_y->type != EnvelopeType_Scaling_Y)))) &&
     ((this->envl_z == (Envelope *)0x0 || (this->envl_z->type != EnvelopeType_Scaling_Z)))) {
    key_dummy.time._0_4_ = 0;
  }
  else {
    key_dummy.time._0_4_ = 0x3f800000;
  }
  if (this->envl_x == (Envelope *)0x0) {
    this->envl_x = (Envelope *)&def_y.old_last;
    std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::push_back
              (&this->envl_x->keys,(value_type *)local_108);
  }
  if (this->envl_y == (Envelope *)0x0) {
    this->envl_y = (Envelope *)&def_z.old_last;
    std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::push_back
              (&this->envl_y->keys,(value_type *)local_108);
  }
  if (this->envl_z == (Envelope *)0x0) {
    this->envl_z = (Envelope *)(key_dummy.params + 4);
    std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::push_back
              (&this->envl_z->keys,(value_type *)local_108);
  }
  local_128 = (pointer)0x3ff0000000000000;
  if ((this->flags & 1) == 0) {
    local_148 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::size
                          (&this->envl_x->keys);
    local_150 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::size
                          (&this->envl_x->keys);
    local_158 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::size
                          (&this->envl_z->keys);
    __b_00 = std::max<unsigned_long>(&local_150,&local_158);
    pdVar3 = (double *)std::max<unsigned_long>(&local_148,__b_00);
    sr = *pdVar3;
  }
  else {
    if ((this->sample_rate != 0.0) || (NAN(this->sample_rate))) {
      local_128 = (pointer)this->sample_rate;
    }
    else {
      local_128 = (pointer)0x4059000000000000;
    }
    this->sample_delta = 1.0 / (double)local_128;
    std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::rbegin
              ((vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_> *)
               &stack0xfffffffffffffed0);
    __a = std::
          reverse_iterator<__gnu_cxx::__normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>_>
          ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>_>
                        *)&stack0xfffffffffffffed0);
    std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::rbegin
              ((vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_> *)(local_140 + 8));
    __a_00 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>_>
                           *)(local_140 + 8));
    std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::rbegin
              ((vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_> *)local_140);
    __b = std::
          reverse_iterator<__gnu_cxx::__normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>_>
          ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>_>
                        *)local_140);
    pdVar3 = std::max<double>(&__a_00->time,&__b->time);
    pdVar3 = std::max<double>(&__a->time,pdVar3);
    uVar4 = (ulong)(*pdVar3 * (double)local_128);
    sr = (double)(uVar4 | (long)(*pdVar3 * (double)local_128 - 9.223372036854776e+18) &
                          (long)uVar4 >> 0x3f);
  }
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::reserve(out,(long)sr + ((ulong)sr >> 1));
  local_168._M_current =
       (Key *)std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::begin
                        (&this->envl_x->keys);
  __gnu_cxx::
  __normal_iterator<Assimp::LWO::Key_const*,std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>>
  ::__normal_iterator<Assimp::LWO::Key*>
            ((__normal_iterator<Assimp::LWO::Key_const*,std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>>
              *)&local_160,&local_168);
  (this->cur_x)._M_current = local_160;
  local_178._M_current =
       (Key *)std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::begin
                        (&this->envl_y->keys);
  __gnu_cxx::
  __normal_iterator<Assimp::LWO::Key_const*,std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>>
  ::__normal_iterator<Assimp::LWO::Key*>
            ((__normal_iterator<Assimp::LWO::Key_const*,std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>>
              *)&local_170,&local_178);
  (this->cur_y)._M_current = local_170;
  fill._16_8_ = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::begin
                          (&this->envl_z->keys);
  __gnu_cxx::
  __normal_iterator<Assimp::LWO::Key_const*,std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>>
  ::__normal_iterator<Assimp::LWO::Key*>
            ((__normal_iterator<Assimp::LWO::Key_const*,std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>>
              *)&local_180,
             (__normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
              *)&fill.mValue.z);
  (this->cur_z)._M_current = local_180;
  this->end_z = false;
  this->end_y = false;
  this->end_x = false;
  do {
    aiVectorKey::aiVectorKey((aiVectorKey *)&lasttime);
    pKVar5 = __gnu_cxx::
             __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
             ::operator*(&this->cur_x);
    dVar1 = pKVar5->time;
    pKVar5 = __gnu_cxx::
             __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
             ::operator*(&this->cur_y);
    if ((dVar1 != pKVar5->time) || (NAN(dVar1) || NAN(pKVar5->time))) {
LAB_00b65348:
      pKVar5 = __gnu_cxx::
               __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
               ::operator*(&this->cur_x);
      dVar1 = pKVar5->time;
      pKVar5 = __gnu_cxx::
               __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
               ::operator*(&this->cur_y);
      if ((pKVar5->time < dVar1) || ((this->end_x & 1U) != 0)) {
        pKVar5 = __gnu_cxx::
                 __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                 ::operator*(&this->cur_z);
        dVar1 = pKVar5->time;
        pKVar5 = __gnu_cxx::
                 __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                 ::operator*(&this->cur_y);
        if ((pKVar5->time < dVar1) || ((this->end_y & 1U) != 0)) {
          if ((this->end_y & 1U) == 0) {
            pKVar5 = __gnu_cxx::
                     __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                     ::operator*(&this->cur_y);
            InterpolateTrack(this,out,(aiVectorKey *)&lasttime,pKVar5->time);
          }
          else if ((this->end_y & 1U) == 0) {
            if ((this->end_x & 1U) == 0) {
              if ((this->end_y & 1U) == 0) {
                local_2c8 = __gnu_cxx::
                            __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                            ::operator*(&this->cur_y);
              }
              else {
                local_2c8 = __gnu_cxx::
                            __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                            ::operator*(&this->cur_x);
              }
              InterpolateTrack(this,out,(aiVectorKey *)&lasttime,local_2c8->time);
            }
            else {
              if ((this->end_z & 1U) == 0) {
                local_2b8 = __gnu_cxx::
                            __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                            ::operator*(&this->cur_z);
              }
              else {
                local_2b8 = __gnu_cxx::
                            __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                            ::operator*(&this->cur_y);
              }
              InterpolateTrack(this,out,(aiVectorKey *)&lasttime,local_2b8->time);
            }
          }
          else {
            if ((this->end_x & 1U) == 0) {
              local_2a8 = __gnu_cxx::
                          __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                          ::operator*(&this->cur_x);
            }
            else {
              local_2a8 = __gnu_cxx::
                          __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                          ::operator*(&this->cur_z);
            }
            InterpolateTrack(this,out,(aiVectorKey *)&lasttime,local_2a8->time);
          }
        }
        else {
          pKVar5 = __gnu_cxx::
                   __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                   ::operator*(&this->cur_y);
          InterpolateTrack(this,out,(aiVectorKey *)&lasttime,pKVar5->time);
        }
      }
      else {
        pKVar5 = __gnu_cxx::
                 __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                 ::operator*(&this->cur_z);
        dVar1 = pKVar5->time;
        pKVar5 = __gnu_cxx::
                 __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                 ::operator*(&this->cur_x);
        if ((pKVar5->time < dVar1) || ((this->end_z & 1U) != 0)) {
          pKVar5 = __gnu_cxx::
                   __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                   ::operator*(&this->cur_x);
          InterpolateTrack(this,out,(aiVectorKey *)&lasttime,pKVar5->time);
        }
        else {
          pKVar5 = __gnu_cxx::
                   __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                   ::operator*(&this->cur_z);
          InterpolateTrack(this,out,(aiVectorKey *)&lasttime,pKVar5->time);
        }
      }
    }
    else {
      pKVar5 = __gnu_cxx::
               __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
               ::operator*(&this->cur_x);
      dVar1 = pKVar5->time;
      pKVar5 = __gnu_cxx::
               __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
               ::operator*(&this->cur_z);
      if ((dVar1 != pKVar5->time) || (NAN(dVar1) || NAN(pKVar5->time))) goto LAB_00b65348;
      pKVar5 = __gnu_cxx::
               __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
               ::operator*(&this->cur_x);
      lasttime = pKVar5->time;
      pKVar5 = __gnu_cxx::
               __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
               ::operator*(&this->cur_x);
      fill.mTime._0_4_ = pKVar5->value;
      pKVar5 = __gnu_cxx::
               __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
               ::operator*(&this->cur_y);
      fill.mTime._4_4_ = pKVar5->value;
      pKVar5 = __gnu_cxx::
               __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
               ::operator*(&this->cur_z);
      fill.mValue.x = pKVar5->value;
    }
    local_1a8 = lasttime;
    std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::push_back(out,(value_type *)&lasttime);
    dVar1 = local_1a8;
    pKVar5 = __gnu_cxx::
             __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
             ::operator*(&this->cur_x);
    if (pKVar5->time <= dVar1) {
      local_1b8._M_current =
           (Key *)std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::end
                            (&this->envl_x->keys);
      local_1b0 = __gnu_cxx::
                  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                  ::operator-(&local_1b8,1);
      bVar2 = __gnu_cxx::operator!=(&this->cur_x,&local_1b0);
      if (bVar2) {
        __gnu_cxx::
        __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
        ::operator++(&this->cur_x);
      }
      else {
        this->end_x = true;
      }
    }
    dVar1 = local_1a8;
    pKVar5 = __gnu_cxx::
             __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
             ::operator*(&this->cur_y);
    if (pKVar5->time <= dVar1) {
      local_1c8._M_current =
           (Key *)std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::end
                            (&this->envl_y->keys);
      local_1c0 = __gnu_cxx::
                  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                  ::operator-(&local_1c8,1);
      bVar2 = __gnu_cxx::operator!=(&this->cur_y,&local_1c0);
      if (bVar2) {
        __gnu_cxx::
        __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
        ::operator++(&this->cur_y);
      }
      else {
        this->end_y = true;
      }
    }
    dVar1 = local_1a8;
    pKVar5 = __gnu_cxx::
             __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
             ::operator*(&this->cur_z);
    if (pKVar5->time <= dVar1) {
      it._M_current =
           (aiVectorKey *)
           std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::end
                     (&this->envl_z->keys);
      local_1d0 = __gnu_cxx::
                  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                  ::operator-((__normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
                               *)&it,1);
      bVar2 = __gnu_cxx::operator!=(&this->cur_z,&local_1d0);
      if (bVar2) {
        __gnu_cxx::
        __normal_iterator<const_Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
        ::operator++(&this->cur_z);
      }
      else {
        this->end_z = true;
      }
    }
    if ((((this->end_x & 1U) != 0) && ((this->end_y & 1U) != 0)) && ((this->end_z & 1U) != 0)) {
      if ((this->flags & 2) != 0) {
        local_1e0._M_current =
             (aiVectorKey *)std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::begin(out);
        while( true ) {
          local_1e8._M_current =
               (aiVectorKey *)std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::end(out);
          bVar2 = __gnu_cxx::operator!=(&local_1e0,&local_1e8);
          if (!bVar2) break;
          dVar1 = this->first;
          paVar6 = __gnu_cxx::
                   __normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>
                   ::operator*(&local_1e0);
          paVar6->mTime = paVar6->mTime - dVar1;
          __gnu_cxx::
          __normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>
          ::operator++(&local_1e0);
        }
      }
      Envelope::~Envelope((Envelope *)(key_dummy.params + 4));
      Envelope::~Envelope((Envelope *)&def_z.old_last);
      Envelope::~Envelope((Envelope *)&def_y.old_last);
      return;
    }
  } while( true );
}

Assistant:

void AnimResolver::GetKeys(std::vector<aiVectorKey>& out,
    LWO::Envelope* _envl_x,
    LWO::Envelope* _envl_y,
    LWO::Envelope* _envl_z,
    unsigned int _flags)
{
    envl_x = _envl_x;
    envl_y = _envl_y;
    envl_z = _envl_z;
    flags  = _flags;

    // generate default channels if none are given
    LWO::Envelope def_x, def_y, def_z;
    LWO::Key key_dummy;
    key_dummy.time = 0.f;
    if ((envl_x && envl_x->type == LWO::EnvelopeType_Scaling_X) ||
        (envl_y && envl_y->type == LWO::EnvelopeType_Scaling_Y) ||
        (envl_z && envl_z->type == LWO::EnvelopeType_Scaling_Z)) {
        key_dummy.value = 1.f;
    }
    else key_dummy.value = 0.f;

    if (!envl_x) {
        envl_x = &def_x;
        envl_x->keys.push_back(key_dummy);
    }
    if (!envl_y) {
        envl_y = &def_y;
        envl_y->keys.push_back(key_dummy);
    }
    if (!envl_z) {
        envl_z = &def_z;
        envl_z->keys.push_back(key_dummy);
    }

    // guess how many keys we'll get
    size_t reserve;
    double sr = 1.;
    if (flags & AI_LWO_ANIM_FLAG_SAMPLE_ANIMS) {
        if (!sample_rate)
            sr = 100.f;
        else sr = sample_rate;
        sample_delta = 1.f / sr;

        reserve = (size_t)(
            std::max( envl_x->keys.rbegin()->time,
            std::max( envl_y->keys.rbegin()->time, envl_z->keys.rbegin()->time )) * sr);
    }
    else reserve = std::max(envl_x->keys.size(),std::max(envl_x->keys.size(),envl_z->keys.size()));
    out.reserve(reserve+(reserve>>1));

    // Iterate through all three arrays at once - it's tricky, but
    // rather interesting to implement.
    cur_x = envl_x->keys.begin();
    cur_y = envl_y->keys.begin();
    cur_z = envl_z->keys.begin();

    end_x = end_y = end_z = false;
    while (1) {

        aiVectorKey fill;

        if ((*cur_x).time == (*cur_y).time && (*cur_x).time == (*cur_z).time ) {

            // we have a keyframe for all of them defined .. this means
            // we don't need to interpolate here.
            fill.mTime = (*cur_x).time;

            fill.mValue.x = (*cur_x).value;
            fill.mValue.y = (*cur_y).value;
            fill.mValue.z = (*cur_z).value;

            // subsample animation track
            if (flags & AI_LWO_ANIM_FLAG_SAMPLE_ANIMS) {
                //SubsampleAnimTrack(out,cur_x, cur_y, cur_z, d, sample_delta);
            }
        }

        // Find key with lowest time value
        else if ((*cur_x).time <= (*cur_y).time && !end_x) {

            if ((*cur_z).time <= (*cur_x).time && !end_z) {
                InterpolateTrack(out,fill,(*cur_z).time);
            }
            else {
                InterpolateTrack(out,fill,(*cur_x).time);
            }
        }
        else if ((*cur_z).time <= (*cur_y).time && !end_y)  {
            InterpolateTrack(out,fill,(*cur_y).time);
        }
        else if (!end_y) {
            // welcome on the server, y
            InterpolateTrack(out,fill,(*cur_y).time);
        }
        else {
            // we have reached the end of at least 2 channels,
            // only one is remaining. Extrapolate the 2.
            if (end_y) {
                InterpolateTrack(out,fill,(end_x ? (*cur_z) : (*cur_x)).time);
            }
            else if (end_x) {
                InterpolateTrack(out,fill,(end_z ? (*cur_y) : (*cur_z)).time);
            }
            else { // if (end_z)
                InterpolateTrack(out,fill,(end_y ? (*cur_x) : (*cur_y)).time);
            }
        }
        double lasttime = fill.mTime;
        out.push_back(fill);

        if (lasttime >= (*cur_x).time) {
            if (cur_x != envl_x->keys.end()-1)
                ++cur_x;
            else end_x = true;
        }
        if (lasttime >= (*cur_y).time) {
            if (cur_y != envl_y->keys.end()-1)
                ++cur_y;
            else end_y = true;
        }
        if (lasttime >= (*cur_z).time) {
            if (cur_z != envl_z->keys.end()-1)
                ++cur_z;
            else end_z = true;
        }

        if( end_x && end_y && end_z ) /* finished? */
            break;
    }

    if (flags & AI_LWO_ANIM_FLAG_START_AT_ZERO) {
        for (std::vector<aiVectorKey>::iterator it = out.begin(); it != out.end(); ++it)
            (*it).mTime -= first;
    }
}